

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  AbstractMajor *this;
  CourseComponent *root;
  ShallowPrint *this_00;
  iterator iVar3;
  string major;
  string userInput;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  majorCourses;
  CatalogReader reader;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f8;
  CatalogReader local_c0;
  
  local_150 = local_140;
  local_148 = 0;
  local_140[0] = 0;
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_f8._M_bucket_count = 1;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_element_count = 0;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter a major (ALL UPPERCASE): ",0x1f);
  std::operator>>((istream *)&std::cin,(string *)&local_150);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar2 = std::__cxx11::string::compare((char *)&local_150);
  if (iVar2 == 0) {
LAB_0010900b:
    this = (AbstractMajor *)operator_new(0x40);
    Bioengineering::Bioengineering((Bioengineering *)this);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_150);
    if (iVar2 == 0) goto LAB_0010900b;
    iVar2 = std::__cxx11::string::compare((char *)&local_150);
    if (iVar2 == 0) {
LAB_00109025:
      this = (AbstractMajor *)operator_new(0x40);
      ChemicalEngineering::ChemicalEngineering((ChemicalEngineering *)this);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_150);
      if (iVar2 == 0) goto LAB_00109025;
      iVar2 = std::__cxx11::string::compare((char *)&local_150);
      if (iVar2 == 0) {
LAB_0010903f:
        this = (AbstractMajor *)operator_new(0x40);
        ComputerEngineering::ComputerEngineering((ComputerEngineering *)this);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_150);
        if (iVar2 == 0) goto LAB_0010903f;
        iVar2 = std::__cxx11::string::compare((char *)&local_150);
        if (iVar2 == 0) {
LAB_00109056:
          this = (AbstractMajor *)operator_new(0x40);
          ComputerScience::ComputerScience((ComputerScience *)this);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_150);
          if (iVar2 == 0) goto LAB_00109056;
          iVar2 = std::__cxx11::string::compare((char *)&local_150);
          if (iVar2 == 0) {
LAB_0010906d:
            this = (AbstractMajor *)operator_new(0x40);
            CSBusinessApplications::CSBusinessApplications((CSBusinessApplications *)this);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_150);
            if (iVar2 == 0) goto LAB_0010906d;
            iVar2 = std::__cxx11::string::compare((char *)&local_150);
            if (iVar2 == 0) {
LAB_00109084:
              this = (AbstractMajor *)operator_new(0x40);
              ElectricalEngineering::ElectricalEngineering((ElectricalEngineering *)this);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_150);
              if (iVar2 == 0) goto LAB_00109084;
              iVar2 = std::__cxx11::string::compare((char *)&local_150);
              if (iVar2 == 0) {
LAB_0010909b:
                this = (AbstractMajor *)operator_new(0x40);
                EnvironmentalEngineering::EnvironmentalEngineering((EnvironmentalEngineering *)this)
                ;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_150);
                if (iVar2 == 0) goto LAB_0010909b;
                iVar2 = std::__cxx11::string::compare((char *)&local_150);
                if (iVar2 == 0) {
LAB_001090b2:
                  this = (AbstractMajor *)operator_new(0x40);
                  MechanicalEngineering::MechanicalEngineering((MechanicalEngineering *)this);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_150);
                  if (iVar2 == 0) goto LAB_001090b2;
                  iVar2 = std::__cxx11::string::compare((char *)&local_150);
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::string::compare((char *)&local_150);
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)&local_150);
                      if (iVar2 != 0) goto LAB_0010935b;
                    }
                  }
                  this = (AbstractMajor *)operator_new(0x40);
                  MaterialScience::MaterialScience((MaterialScience *)this);
                }
              }
            }
          }
        }
      }
    }
  }
  AbstractMajor::getRequirements(this);
  CatalogReader::CatalogReader(&local_c0,this);
  CatalogReader::setDebugOn(&local_c0,false);
  CatalogReader::createCourseHeirarchy_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
              *)local_130,&local_c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&local_f8,local_130);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_130);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Succesfully retreived heirarchy",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  root = buildGraph((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                     *)&local_f8,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DISPLAYING COURSE TREE ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  this_00 = (ShallowPrint *)operator_new(8);
  (this_00->super_PrintAlgorithm)._vptr_PrintAlgorithm = (_func_int **)&PTR_print_00110d40;
  ShallowPrint::print(this_00,root);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Enter taken courses in the format of: \'CHEM 001A\'. Enter \'Q\' when done.",0x47);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_130._8_8_ = 0;
  local_130[0x10] = '\0';
  local_130._0_8_ = local_130 + 0x10;
  std::operator>>((istream *)&std::cin,(string *)local_130);
  while( true ) {
    iVar2 = std::__cxx11::string::compare((char *)local_130);
    if (iVar2 == 0) {
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.endDebugString._M_dataplus._M_p != &local_c0.endDebugString.field_2) {
        operator_delete(local_c0.endDebugString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.beginDebugString._M_dataplus._M_p != &local_c0.beginDebugString.field_2) {
        operator_delete(local_c0.beginDebugString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.resourceExtension._M_dataplus._M_p != &local_c0.resourceExtension.field_2) {
        operator_delete(local_c0.resourceExtension._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.resourcesPath._M_dataplus._M_p != &local_c0.resourcesPath.field_2) {
        operator_delete(local_c0.resourcesPath._M_dataplus._M_p);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f8);
      if (local_150 != local_140) {
        operator_delete(local_150);
      }
      return 0;
    }
    std::operator>>((istream *)&std::cin,(string *)local_130);
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_f8,(key_type *)local_130);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_true>
        ._M_cur == (__node_type *)0x0) break;
    puVar1 = (undefined8 *)
             **(long **)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_true>
                               ._M_cur + 0x28);
    if ((undefined8 *)
        (*(long **)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_true>
                          ._M_cur + 0x28))[1] == puVar1) goto LAB_00109349;
    (*(root->super_Observer)._vptr_Observer[2])(root,*puVar1);
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_00109349:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0010935b:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid major entered.",0x16);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(1);
}

Assistant:

int main() {

    string major;
    CourseComponent* root;
    unordered_map<string, vector<CourseComponent*>*> majorCourses;
    PrintAlgorithm* printer;

    cout << "Enter a major (ALL UPPERCASE): ";
    cin >> major;
    cout << endl;

    // Convert user string to uppercase for simplicity purposes

    AbstractMajor* userMajor;
    if (major == "BIOENGINEERING" || major == "BIEN") {
        userMajor = new Bioengineering();
    }

    else if (major == "CHEMICAL ENGINEERING" || major == "CHE") {
        userMajor = new ChemicalEngineering();
    }

    else if (major == "COMPUTER ENGINEERING" || major == "CEN") {
        userMajor = new ComputerEngineering();
    }

    else if (major == "COMPUTER SCINECE" || major == "CS") {
        userMajor = new ComputerScience();
    }

    else if (major == "COMPUTER SCIENCE WITH BUSINESS APPLICATIONS" || major == "CSBA") {
        userMajor = new CSBusinessApplications();
    }

    else if (major == "ELECTRICAL ENGINEERING" || major == "EE") {
        userMajor = new ElectricalEngineering();
    }

    else if (major == "ENVIRONMENTAL ENGINEERING" || major == "ENVE") {
        userMajor = new EnvironmentalEngineering();
    }

    else if (major == "MECHANICAL ENGINEERING" || major == "ME") {
        userMajor = new MechanicalEngineering();
    }

    else if (major == "MATERIALS SCIENCE AND ENGINEERING" || major == "MSE" || major == "MATERIAL SCIENCE AND ENGINEERING") {
        userMajor = new MaterialScience();
    }

    // Program exits if the user inputs an invalid major
    else {
        cout << "Invalid major entered." << endl;
        exit(1);
    }

    userMajor->getRequirements();
    // Pass in the major to the CatalogReader
    CatalogReader reader(userMajor);

    reader.setDebugOn(false);
    // Returns unordered map of courses, stored by "name of course", <vector of linked courses and itself>
    majorCourses = reader.createCourseHeirarchy();
    cout << "Succesfully retreived heirarchy" << endl;
    root = buildGraph(majorCourses, false);


    cout << "DISPLAYING COURSE TREE " << endl;
    
    printer = new ShallowPrint();
    printer->print(root);

    cout << "Enter taken courses in the format of: 'CHEM 001A'. Enter 'Q' when done." << endl;
    string userInput;
    cin >> userInput;

    while (userInput != "Q") {
        cin >> userInput;
        root->remove(majorCourses.at(userInput)->at(0));
    }
}